

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_islow(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  
  uVar8 = (ulong)start_col;
  for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 8) {
    lVar9 = *(long *)((long)sample_data + lVar10);
    bVar1 = *(byte *)(lVar9 + 7 + uVar8);
    uVar19 = (uint)*(byte *)(lVar9 + uVar8) + (uint)bVar1;
    bVar2 = *(byte *)(lVar9 + 1 + uVar8);
    bVar3 = *(byte *)(lVar9 + 6 + uVar8);
    uVar12 = (uint)bVar2 + (uint)bVar3;
    bVar4 = *(byte *)(lVar9 + 2 + uVar8);
    bVar5 = *(byte *)(lVar9 + 5 + uVar8);
    uVar21 = (uint)bVar4 + (uint)bVar5;
    bVar6 = *(byte *)(lVar9 + 3 + uVar8);
    bVar7 = *(byte *)(lVar9 + 4 + uVar8);
    uVar15 = (uint)bVar6 + (uint)bVar7;
    lVar13 = (ulong)uVar19 - (ulong)uVar15;
    iVar16 = uVar15 + uVar19;
    lVar20 = (ulong)uVar12 - (ulong)uVar21;
    iVar22 = uVar21 + uVar12;
    lVar18 = (ulong)*(byte *)(lVar9 + uVar8) - (ulong)bVar1;
    lVar17 = (ulong)bVar2 - (ulong)bVar3;
    lVar14 = (ulong)bVar4 - (ulong)bVar5;
    lVar9 = (ulong)bVar6 - (ulong)bVar7;
    data[lVar10] = (iVar16 + iVar22) * 4 + -0x1000;
    data[lVar10 + 4] = (iVar16 - iVar22) * 4;
    lVar11 = (lVar13 + lVar20) * 0x1151;
    data[lVar10 + 2] = (DCTELEM)(lVar13 * 0x187e + lVar11 + 0x400U >> 0xb);
    data[lVar10 + 6] = (DCTELEM)(lVar11 + lVar20 * 0x7ffffffc4df + 0x400U >> 0xb);
    lVar13 = (lVar9 + lVar17 + lVar14 + lVar18) * 0x25a1;
    lVar11 = (lVar14 + lVar18) * -0xc7c + lVar13 + 0x400;
    lVar13 = lVar13 + (lVar9 + lVar17) * -0x3ec5 + 0x400;
    lVar20 = (lVar9 + lVar18) * -0x1ccd;
    data[lVar10 + 1] = (DCTELEM)((ulong)(lVar18 * 0x300b + lVar20 + lVar11) >> 0xb);
    lVar18 = (lVar14 + lVar17) * -0x5203;
    data[lVar10 + 3] = (DCTELEM)((ulong)(lVar17 * 0x6254 + lVar18 + lVar13) >> 0xb);
    data[lVar10 + 5] = (DCTELEM)((ulong)(lVar14 * 0x41b3 + lVar18 + lVar11) >> 0xb);
    data[lVar10 + 7] = (DCTELEM)((ulong)(lVar9 * 0x98e + lVar20 + lVar13) >> 0xb);
  }
  for (iVar16 = 7; -1 < iVar16; iVar16 = iVar16 + -1) {
    iVar22 = *data;
    lVar18 = (long)(data[0x38] + iVar22);
    lVar13 = (long)(data[0x30] + data[8]);
    lVar9 = (long)(data[0x28] + data[0x10]);
    lVar10 = (long)(data[0x18] + data[0x20]);
    lVar20 = lVar18 + lVar10 + 2;
    lVar18 = lVar18 - lVar10;
    lVar10 = lVar13 + lVar9;
    lVar13 = lVar13 - lVar9;
    *data = (int)((ulong)(lVar20 + lVar10) >> 2);
    lVar17 = (long)(iVar22 - data[0x38]);
    lVar14 = (long)(data[8] - data[0x30]);
    lVar11 = (long)(data[0x10] - data[0x28]);
    lVar9 = (long)(data[0x18] - data[0x20]);
    data[0x20] = (int)((ulong)(lVar20 - lVar10) >> 2);
    lVar10 = (lVar18 + lVar13) * 0x1151;
    data[0x10] = (int)(lVar18 * 0x187e + lVar10 + 0x4000U >> 0xf);
    data[0x30] = (int)(lVar10 + lVar13 * 0x7fffffffc4df + 0x4000U >> 0xf);
    lVar13 = (lVar9 + lVar14 + lVar11 + lVar17) * 0x25a1;
    lVar10 = (lVar11 + lVar17) * -0xc7c + lVar13 + 0x4000;
    lVar13 = (lVar9 + lVar14) * -0x3ec5 + lVar13 + 0x4000;
    lVar18 = (lVar9 + lVar17) * -0x1ccd;
    data[8] = (int)((ulong)(lVar17 * 0x300b + lVar18 + lVar10) >> 0xf);
    lVar17 = (lVar11 + lVar14) * -0x5203;
    data[0x18] = (int)((ulong)(lVar14 * 0x6254 + lVar17 + lVar13) >> 0xf);
    data[0x28] = (int)((ulong)(lVar11 * 0x41b3 + lVar17 + lVar10) >> 0xf);
    data[0x38] = (int)((ulong)(lVar9 * 0x98e + lVar18 + lVar13) >> 0xf);
    data = data + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_islow (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  INT32 tmp10, tmp11, tmp12, tmp13;
  INT32 z1;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  dataptr = data;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]);

    tmp10 = tmp0 + tmp3;
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM) ((tmp10 + tmp11 - 8 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[4] = (DCTELEM) ((tmp10 - tmp11) << PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS-PASS1_BITS-1);
    dataptr[2] = (DCTELEM) RIGHT_SHIFT(z1 + MULTIPLY(tmp12, FIX_0_765366865),
				       CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM) RIGHT_SHIFT(z1 - MULTIPLY(tmp13, FIX_1_847759065),
				       CONST_BITS-PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS-PASS1_BITS-1);

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + tmp10 + tmp12, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM)
      RIGHT_SHIFT(tmp1 + tmp11 + tmp13, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM)
      RIGHT_SHIFT(tmp2 + tmp11 + tmp12, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM)
      RIGHT_SHIFT(tmp3 + tmp10 + tmp13, CONST_BITS-PASS1_BITS);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];

    /* Add fudge factor here for final descale. */
    tmp10 = tmp0 + tmp3 + (ONE << (PASS1_BITS-1));
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    dataptr[DCTSIZE*0] = (DCTELEM) RIGHT_SHIFT(tmp10 + tmp11, PASS1_BITS);
    dataptr[DCTSIZE*4] = (DCTELEM) RIGHT_SHIFT(tmp10 - tmp11, PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS+PASS1_BITS-1);
    dataptr[DCTSIZE*2] = (DCTELEM)
      RIGHT_SHIFT(z1 + MULTIPLY(tmp12, FIX_0_765366865), CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*6] = (DCTELEM)
      RIGHT_SHIFT(z1 - MULTIPLY(tmp13, FIX_1_847759065), CONST_BITS+PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS+PASS1_BITS-1);

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[DCTSIZE*1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + tmp10 + tmp12, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      RIGHT_SHIFT(tmp1 + tmp11 + tmp13, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*5] = (DCTELEM)
      RIGHT_SHIFT(tmp2 + tmp11 + tmp12, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*7] = (DCTELEM)
      RIGHT_SHIFT(tmp3 + tmp10 + tmp13, CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}